

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

void __thiscall FIX::Session::disconnect(Session *this)

{
  bool bVar1;
  UtcTimeStamp local_88;
  string local_70;
  allocator<char> local_39;
  string local_38;
  Locker local_18;
  Locker l;
  Session *this_local;
  
  l.m_mutex = (Mutex *)this;
  Locker::Locker(&local_18,&this->m_mutex);
  if (this->m_pResponder != (Responder *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Disconnecting",&local_39);
    SessionState::onEvent(&this->m_state,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    (*this->m_pResponder->_vptr_Responder[3])();
    this->m_pResponder = (Responder *)0x0;
  }
  bVar1 = SessionState::receivedLogon(&this->m_state);
  if ((bVar1) || (bVar1 = SessionState::sentLogon(&this->m_state), bVar1)) {
    SessionState::receivedLogon(&this->m_state,false);
    SessionState::sentLogon(&this->m_state,false);
    (**(code **)(*(long *)this->m_application + 0x20))();
  }
  SessionState::sentLogout(&this->m_state,false);
  SessionState::receivedReset(&this->m_state,false);
  SessionState::sentReset(&this->m_state,false);
  SessionState::clearQueue(&this->m_state);
  SessionState::logoutReason_abi_cxx11_(&local_70,&this->m_state);
  std::__cxx11::string::~string((string *)&local_70);
  if ((this->m_resetOnDisconnect & 1U) != 0) {
    std::function<FIX::UtcTimeStamp_()>::operator()(&local_88,&this->m_timestamper);
    SessionState::reset(&this->m_state,&local_88);
    UtcTimeStamp::~UtcTimeStamp(&local_88);
  }
  SessionState::resendRange(&this->m_state,0,0);
  Locker::~Locker(&local_18);
  return;
}

Assistant:

void Session::disconnect() {
  Locker l(m_mutex);

  if (m_pResponder) {
    m_state.onEvent("Disconnecting");

    m_pResponder->disconnect();
    m_pResponder = 0;
  }

  if (m_state.receivedLogon() || m_state.sentLogon()) {
    m_state.receivedLogon(false);
    m_state.sentLogon(false);
    m_application.onLogout(m_sessionID);
  }

  m_state.sentLogout(false);
  m_state.receivedReset(false);
  m_state.sentReset(false);
  m_state.clearQueue();
  m_state.logoutReason();
  if (m_resetOnDisconnect) {
    m_state.reset(m_timestamper());
  }

  m_state.resendRange(0, 0);
}